

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O3

int Dau_DecCheckSetTopOld
              (word *p,int nVars,int nVarsF,int nVarsB,int nVarsS,int maskS,word **pCof0,
              word **pCof1,word **pDec)

{
  ulong uVar1;
  ulong uVar2;
  word *pwVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  word *pwVar7;
  int iVar8;
  word *pwVar9;
  ulong uVar10;
  int pVarsS [16];
  
  uVar6 = 1 << ((byte)nVarsS & 0x1f);
  if (0xd < nVars - 3U) {
    __assert_fail("nVars >= 3 && nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                  ,0x12d,
                  "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                 );
  }
  if (nVarsB + nVarsF != nVars) {
    __assert_fail("nVars == nVarsF + nVarsB",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                  ,0x12e,
                  "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                 );
  }
  if ((nVarsF < 1) || (nVars - 2U < (uint)nVarsF)) {
    __assert_fail("nVarsF >= 1 && nVarsF <= nVars - 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                  ,0x12f,
                  "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                 );
  }
  if ((1 < nVarsB) && (nVarsB < nVars)) {
    if ((nVarsS < 0) || (nVarsB - 2U < (uint)nVarsS)) {
      __assert_fail("nVarsS >= 0 && nVarsS <= nVarsB - 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                    ,0x131,
                    "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                   );
    }
    if (nVarsS == 0) {
      if (pCof0 == (word **)0x0) {
        pwVar7 = (word *)0x0;
      }
      else {
        pwVar7 = *pCof0;
      }
      if (pCof1 == (word **)0x0) {
        pwVar3 = (word *)0x0;
      }
      else {
        pwVar3 = *pCof1;
      }
      if (pDec == (word **)0x0) {
        pwVar9 = (word *)0x0;
      }
      else {
        pwVar9 = *pDec;
      }
      iVar8 = Dau_DecCheckSetAny(p,nVars,nVarsF,0,0,pwVar7,pwVar3,pwVar9);
    }
    else {
      if ((maskS < 1) || ((uint)maskS >> ((byte)nVarsB & 0x1f) != 0)) {
        __assert_fail("maskS > 0 && maskS < (1 << nVarsB)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                      ,0x135,
                      "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                     );
      }
      uVar4 = 0;
      iVar8 = 0;
      do {
        if (((uint)maskS >> (uVar4 & 0x1f) & 1) != 0) {
          lVar5 = (long)iVar8;
          iVar8 = iVar8 + 1;
          pVarsS[lVar5] = uVar4;
        }
        uVar4 = uVar4 + 1;
      } while (nVarsB != uVar4);
      if (iVar8 != nVarsS) {
        __assert_fail("i == nVarsS",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                      ,0x139,
                      "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                     );
      }
      iVar8 = 1;
      if (nVarsS != 0x1f) {
        uVar1 = 1;
        if (1 < (int)uVar6) {
          uVar1 = (ulong)uVar6;
        }
        uVar10 = 0;
        do {
          uVar2 = 0;
          uVar6 = 0;
          do {
            if (((uint)uVar10 >> ((uint)uVar2 & 0x1f) & 1) != 0) {
              uVar6 = uVar6 | 1 << (*(byte *)(pVarsS + uVar2) & 0x1f);
            }
            uVar2 = uVar2 + 1;
          } while ((uint)nVarsS != uVar2);
          if ((uVar6 & ~maskS) != 0) {
            __assert_fail("(maskS & uMaskValue) == uMaskValue",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                          ,0x142,
                          "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                         );
          }
          if (pCof0 == (word **)0x0) {
            pwVar7 = (word *)0x0;
          }
          else {
            pwVar7 = pCof0[uVar10];
          }
          if (pCof1 == (word **)0x0) {
            pwVar3 = (word *)0x0;
          }
          else {
            pwVar3 = pCof1[uVar10];
          }
          if (pDec == (word **)0x0) {
            pwVar9 = (word *)0x0;
          }
          else {
            pwVar9 = pDec[uVar10];
          }
          iVar8 = Dau_DecCheckSetAny(p,nVars,nVarsF,maskS,uVar6,pwVar7,pwVar3,pwVar9);
          if (iVar8 == 0) {
            return 0;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar1);
        iVar8 = 1;
      }
    }
    return iVar8;
  }
  __assert_fail("nVarsB >= 2 && nVarsB <= nVars - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                ,0x130,
                "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
               );
}

Assistant:

int Dau_DecCheckSetTopOld( word * p, int nVars, int nVarsF, int nVarsB, int nVarsS, int maskS, word ** pCof0, word ** pCof1, word ** pDec )
{
    int i, pVarsS[16];
    int v, m, mMax = (1 << nVarsS), uMaskValue;
    assert( nVars >= 3 && nVars <= 16 );
    assert( nVars == nVarsF + nVarsB );
    assert( nVarsF >= 1 && nVarsF <= nVars - 2 );
    assert( nVarsB >= 2 && nVarsB <= nVars - 1 );
    assert( nVarsS >= 0 && nVarsS <= nVarsB - 2 );
    if ( nVarsS == 0 )
        return Dau_DecCheckSetAny( p, nVars, nVarsF, 0, 0, pCof0? pCof0[0] : 0, pCof1? pCof1[0] : 0, pDec? pDec[0] : 0 );
    // collect shared variables
    assert( maskS > 0 && maskS < (1 << nVarsB) );
    for ( i = 0, v = 0; v < nVarsB; v++ )
        if ( (maskS >> v) & 1 )
            pVarsS[i++] = v;
    assert( i == nVarsS );
    // go through shared set minterms
    for ( m = 0; m < mMax; m++ )
    {
        // generate share set mask
        uMaskValue = 0;
        for ( v = 0; v < nVarsS; v++ )
            if ( (m >> v) & 1 )
                uMaskValue |= (1 << pVarsS[v]);
        assert( (maskS & uMaskValue) == uMaskValue );
        // check decomposition
        if ( !Dau_DecCheckSetAny( p, nVars, nVarsF, maskS, uMaskValue, pCof0? pCof0[m] : 0, pCof1? pCof1[m] : 0, pDec? pDec[m] : 0 ) )
            return 0;
    }
   return 1;
}